

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeNF
          (ChContactTriangleXYZ *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  char *__function;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  peVar9 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  dVar15 = *(double *)&(peVar9->super_ChNodeFEAbase).field_0x20;
  dVar1 = *(double *)&peVar9->field_0x28;
  dVar2 = *(double *)&peVar9->field_0x30;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  peVar9 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  dVar3 = *(double *)&(peVar9->super_ChNodeFEAbase).field_0x20;
  dVar4 = *(double *)&peVar9->field_0x28;
  dVar5 = *(double *)&peVar9->field_0x30;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  peVar9 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  dVar6 = *(double *)&(peVar9->super_ChNodeFEAbase).field_0x20;
  dVar7 = *(double *)&peVar9->field_0x28;
  dVar8 = *(double *)&peVar9->field_0x30;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  dVar6 = dVar6 - dVar15;
  dVar7 = dVar7 - dVar1;
  dVar8 = dVar8 - dVar2;
  dVar3 = dVar3 - dVar15;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4 * dVar8;
  auVar18 = vfmsub231sd_fma(auVar25,auVar18,auVar23);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 * dVar6;
  auVar20 = vfmsub231sd_fma(auVar24,auVar21,auVar20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3 * dVar7;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar4;
  auVar16 = vfmsub231sd_fma(auVar19,auVar16,auVar22);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar20._0_8_ * auVar20._0_8_;
  auVar18 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
  auVar18 = vfmadd231sd_fma(auVar18,auVar16,auVar16);
  if (auVar18._0_8_ < 0.0) {
    dVar15 = sqrt(auVar18._0_8_);
  }
  else {
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    dVar15 = auVar18._0_8_;
  }
  *detJ = dVar15;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
LAB_0063b54b:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar13 = 3;
      if ((((ulong)pdVar12 & 7) == 0) &&
         (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7), uVar14 < 3)) {
        uVar13 = uVar14;
      }
      dVar15 = (1.0 - U) - V;
      pdVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      if (uVar13 != 0) {
        uVar14 = 0;
        do {
          pdVar12[uVar14] = dVar15 * pdVar11[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      if (uVar13 < 3) {
        do {
          pdVar12[uVar13] = dVar15 * pdVar11[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar13 != 3);
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_0063b54b;
      if (5 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + 3;
        uVar13 = 3;
        if ((((ulong)pdVar12 & 7) == 0) &&
           (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7), uVar14 < 3)) {
          uVar13 = uVar14;
        }
        pdVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        if (uVar13 != 0) {
          uVar14 = 0;
          do {
            pdVar12[uVar14] = U * pdVar11[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        if (uVar13 < 3) {
          do {
            pdVar12[uVar13] = U * pdVar11[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar13 != 3);
        }
        if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3
           ) goto LAB_0063b54b;
        if (8 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + 6;
          uVar13 = 3;
          if ((((ulong)pdVar12 & 7) == 0) &&
             (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7), uVar14 < 3)) {
            uVar13 = uVar14;
          }
          pdVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if (uVar13 != 0) {
            uVar14 = 0;
            do {
              pdVar12[uVar14] = V * pdVar11[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
          if (uVar13 < 3) {
            do {
              pdVar12[uVar13] = V * pdVar11[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar13 != 3);
          }
          return;
        }
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChContactTriangleXYZ::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChMatrixNM<double, 1, 3> N;
    // shape functions (U and V in 0..1 as triangle integration)
    N(0) = 1 - U - V;
    N(1) = U;
    N(2) = V;

    // determinant of jacobian is also =2*areaoftriangle, also length of cross product of sides
    ChVector<> p0 = GetNode1()->GetPos();
    ChVector<> p1 = GetNode2()->GetPos();
    ChVector<> p2 = GetNode3()->GetPos();
    detJ = (Vcross(p2 - p0, p1 - p0)).Length();

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(1) * F.segment(0, 3);
    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}